

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O0

void __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<float>::~VertexBufferObject
          (VertexBufferObject<float> *this)

{
  glDisableVertexAttribArrayFunc p_Var1;
  bool bVar2;
  GLenum err;
  GLuint *pGVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  iterator i_enabled_array;
  VertexBufferObject<float> *this_local;
  
  i_enabled_array._M_current = (int *)this;
  (*this->m_gl->deleteBuffers)(1,&this->m_vertex_buffer_object_id);
  err = (*this->m_gl->getError)();
  glu::checkError(err,"glDeleteBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                  ,0x161);
  local_18._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(&this->m_enabled_arrays);
  while( true ) {
    local_20._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end(&this->m_enabled_arrays);
    bVar2 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar2) break;
    p_Var1 = this->m_gl->disableVertexAttribArray;
    pGVar3 = (GLuint *)
             __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_18);
    (*p_Var1)(*pGVar3);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_18);
  }
  std::vector<int,_std::allocator<int>_>::~vector(&this->m_enabled_arrays);
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::VertexBufferObject<T>::~VertexBufferObject()
{
	m_gl.deleteBuffers(1, &m_vertex_buffer_object_id); /* Delete silently unbinds the buffer. */
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDeleteBuffers call failed.");

	for (std::vector<glw::GLint>::iterator i_enabled_array = m_enabled_arrays.begin();
		 i_enabled_array != m_enabled_arrays.end(); ++i_enabled_array)
	{
		m_gl.disableVertexAttribArray(*i_enabled_array);
	}
}